

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-server.c
# Opt level: O3

void on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  uv_tcp_t *tcp;
  uv_loop_t *loop;
  uv_stream_t *unaff_RBX;
  uv_tcp_t *puVar2;
  uv_loop_t *puVar3;
  undefined8 uStack_28;
  code *pcStack_20;
  
  if (status == 0) {
    puVar3 = (uv_loop_t *)0xf8;
    pcStack_20 = (code *)0x1702e7;
    tcp = (uv_tcp_t *)malloc(0xf8);
    unaff_RBX = server;
    if (tcp == (uv_tcp_t *)0x0) goto LAB_00170339;
    puVar3 = server->loop;
    pcStack_20 = (code *)0x170300;
    puVar2 = tcp;
    iVar1 = uv_tcp_init_ex(puVar3,tcp,2);
    status = (int)puVar2;
    if (iVar1 != 0) goto LAB_0017033e;
    pcStack_20 = (code *)0x17030f;
    puVar2 = tcp;
    puVar3 = (uv_loop_t *)server;
    iVar1 = uv_accept(server,(uv_stream_t *)tcp);
    status = (int)puVar2;
    if (iVar1 == -0x10) {
      pcStack_20 = (code *)0x17031e;
      uv_close((uv_handle_t *)server,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)tcp,free);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x170339;
    on_connection_cold_1();
    puVar3 = (uv_loop_t *)server;
LAB_00170339:
    pcStack_20 = (code *)0x17033e;
    on_connection_cold_4();
LAB_0017033e:
    pcStack_20 = (code *)0x170343;
    on_connection_cold_2();
  }
  pcStack_20 = on_connect;
  on_connection_cold_3();
  if (status == 0) {
    uv_close((uv_handle_t *)puVar3->pending_queue[0],(uv_close_cb)0x0);
    return;
  }
  uStack_28 = (void *)0x17035d;
  on_connect_cold_1();
  uStack_28 = unaff_RBX;
  loop = uv_default_loop();
  puVar3 = loop;
  iVar1 = uv_tcp_init(loop,(uv_tcp_t *)&stack0xfffffffffffffee0);
  if (iVar1 == 0) {
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee0;
    iVar1 = uv_tcp_nodelay((uv_tcp_t *)puVar3,1);
    if (iVar1 != 0) goto LAB_0017040e;
    puVar3 = (uv_loop_t *)&stack0xfffffffffffffee0;
    iVar1 = uv_tcp_keepalive((uv_tcp_t *)puVar3,1,0x3c);
    if (iVar1 != 0) goto LAB_00170413;
    uv_close((uv_handle_t *)&stack0xfffffffffffffee0,(uv_close_cb)0x0);
    iVar1 = uv_run(loop,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      loop = uv_default_loop();
      iVar1 = uv_loop_close(loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0017041d;
    }
  }
  else {
    run_test_tcp_flags_cold_1();
LAB_0017040e:
    run_test_tcp_flags_cold_2();
LAB_00170413:
    loop = puVar3;
    run_test_tcp_flags_cold_3();
  }
  run_test_tcp_flags_cold_4();
LAB_0017041d:
  run_test_tcp_flags_cold_5();
  iVar1 = uv_is_closing((uv_handle_t *)loop);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)loop,(uv_close_cb)0x0);
  return;
}

Assistant:

static void on_connection(uv_stream_t* server, int status) {
  uv_stream_t* stream;
  int r;

  if (status != 0) {
    fprintf(stderr, "Connect error %s\n", uv_err_name(status));
  }
  ASSERT(status == 0);

  switch (serverType) {
  case TCP:
    stream = malloc(sizeof(uv_tcp_t));
    ASSERT(stream != NULL);
    r = uv_tcp_init(loop, (uv_tcp_t*)stream);
    ASSERT(r == 0);
    break;

  case PIPE:
    stream = malloc(sizeof(uv_pipe_t));
    ASSERT(stream != NULL);
    r = uv_pipe_init(loop, (uv_pipe_t*)stream, 0);
    ASSERT(r == 0);
    break;

  default:
    ASSERT(0 && "Bad serverType");
    abort();
  }

  /* associate server with stream */
  stream->data = server;

  r = uv_accept(server, stream);
  ASSERT(r == 0);

  r = uv_read_start(stream, echo_alloc, after_read);
  ASSERT(r == 0);
}